

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_calc_usb_mul_h(DisasContext_conflict14 *ctx,TCGv_i32 arg_low,TCGv_i32 arg_high)

{
  TCGContext_conflict9 *s;
  TCGTemp *ts;
  uintptr_t o;
  TCGv_i32 pTVar1;
  uintptr_t o_1;
  
  s = ctx->uc->tcg_ctx;
  ts = tcg_temp_new_internal_tricore(s,TCG_TYPE_I32,false);
  pTVar1 = arg_low + (long)s;
  tcg_gen_op3_tricore(s,INDEX_op_add_i32,(TCGArg)ts,(TCGArg)pTVar1,(TCGArg)pTVar1);
  tcg_gen_op3_tricore(s,INDEX_op_xor_i32,(TCGArg)ts,(TCGArg)ts,(TCGArg)pTVar1);
  pTVar1 = arg_high + (long)s;
  tcg_gen_op3_tricore(s,INDEX_op_add_i32,(TCGArg)(s->cpu_PSW_AV + (long)s),(TCGArg)pTVar1,
                      (TCGArg)pTVar1);
  tcg_gen_op3_tricore(s,INDEX_op_xor_i32,(TCGArg)(s->cpu_PSW_AV + (long)s),
                      (TCGArg)(s->cpu_PSW_AV + (long)s),(TCGArg)pTVar1);
  tcg_gen_op3_tricore(s,INDEX_op_or_i32,(TCGArg)(s->cpu_PSW_AV + (long)s),
                      (TCGArg)(s->cpu_PSW_AV + (long)s),(TCGArg)ts);
  tcg_gen_op3_tricore(s,INDEX_op_or_i32,(TCGArg)(s->cpu_PSW_SAV + (long)s),
                      (TCGArg)(s->cpu_PSW_SAV + (long)s),(TCGArg)(s->cpu_PSW_AV + (long)s));
  tcg_gen_op2_tricore(s,INDEX_op_movi_i32,(TCGArg)(s->cpu_PSW_V + (long)s),0);
  tcg_temp_free_internal_tricore(s,ts);
  return;
}

Assistant:

static void gen_calc_usb_mul_h(DisasContext *ctx, TCGv arg_low, TCGv arg_high)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    TCGv temp = tcg_temp_new(tcg_ctx);
    /* calc AV bit */
    tcg_gen_add_tl(tcg_ctx, temp, arg_low, arg_low);
    tcg_gen_xor_tl(tcg_ctx, temp, temp, arg_low);
    tcg_gen_add_tl(tcg_ctx, tcg_ctx->cpu_PSW_AV, arg_high, arg_high);
    tcg_gen_xor_tl(tcg_ctx, tcg_ctx->cpu_PSW_AV, tcg_ctx->cpu_PSW_AV, arg_high);
    tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_PSW_AV, tcg_ctx->cpu_PSW_AV, temp);
    /* calc SAV bit */
    tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_PSW_SAV, tcg_ctx->cpu_PSW_SAV, tcg_ctx->cpu_PSW_AV);
    tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_PSW_V, 0);
    tcg_temp_free(tcg_ctx, temp);
}